

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugrid2mesh.c
# Opt level: O0

lint swapi8(lint d)

{
  int iVar1;
  lint in_RDI;
  uchar *src;
  uchar *dst;
  lint a;
  undefined8 local_18;
  undefined1 local_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  undefined8 local_8;
  
  iVar1 = littleEndian();
  local_8 = in_RDI;
  if (iVar1 != 0) {
    uStack_9 = (undefined1)((ulong)in_RDI >> 0x38);
    local_18._0_1_ = uStack_9;
    uStack_a = (undefined1)((ulong)in_RDI >> 0x30);
    local_18._1_1_ = uStack_a;
    uStack_b = (undefined1)((ulong)in_RDI >> 0x28);
    local_18._2_1_ = uStack_b;
    uStack_c = (undefined1)((ulong)in_RDI >> 0x20);
    local_18._3_1_ = uStack_c;
    uStack_d = (undefined1)((ulong)in_RDI >> 0x18);
    local_18._4_1_ = uStack_d;
    uStack_e = (undefined1)((ulong)in_RDI >> 0x10);
    local_18._5_1_ = uStack_e;
    uStack_f = (undefined1)((ulong)in_RDI >> 8);
    local_18._6_1_ = uStack_f;
    local_10 = (undefined1)in_RDI;
    local_18._7_1_ = local_10;
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

lint swapi8(lint d)
{
   lint a;
   unsigned char *dst = (unsigned char *)&a;
   unsigned char *src = (unsigned char *)&d;
   
   if ( ! littleEndian() ) return d;

   dst[0] = src[7];
   dst[1] = src[6];
   dst[2] = src[5];
   dst[3] = src[4];
   dst[4] = src[3];
   dst[5] = src[2];
   dst[6] = src[1];
   dst[7] = src[0];
  
   return a;
}